

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

unique_ptr<spdlog::json_formatter,_std::default_delete<spdlog::json_formatter>_>
spdlog::details::
make_unique<spdlog::json_formatter,std::unordered_set<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,std::hash<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::equal_to<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::allocator<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>>>
          (unordered_set<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>_>
           *args)

{
  json_formatter *this;
  json_formatter *in_RDI;
  pointer in_stack_ffffffffffffff88;
  _Head_base<0UL,_spdlog::json_formatter_*,_false> populators;
  allocator local_31;
  string local_30 [48];
  
  populators._M_head_impl = in_RDI;
  this = (json_formatter *)operator_new(0x60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"\n",&local_31);
  json_formatter::json_formatter(this,(populator_set *)populators._M_head_impl,(string *)in_RDI);
  std::unique_ptr<spdlog::json_formatter,std::default_delete<spdlog::json_formatter>>::
  unique_ptr<std::default_delete<spdlog::json_formatter>,void>
            ((unique_ptr<spdlog::json_formatter,_std::default_delete<spdlog::json_formatter>_> *)
             in_RDI,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return (__uniq_ptr_data<spdlog::json_formatter,_std::default_delete<spdlog::json_formatter>,_true,_true>
          )(tuple<spdlog::json_formatter_*,_std::default_delete<spdlog::json_formatter>_>)
           populators._M_head_impl;
}

Assistant:

std::unique_ptr<T> make_unique(Args &&...args)
{
    static_assert(!std::is_array<T>::value, "arrays not supported");
    return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}